

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O1

int uv_fs_event_start(uv_fs_event_t *handle,uv_fs_event_cb cb,char *path,uint flags)

{
  uint *puVar1;
  uint uVar2;
  uv_loop_t *loop;
  int iVar3;
  int iVar4;
  int *piVar5;
  size_t sVar6;
  long *plVar7;
  void **ppvVar8;
  long *plVar9;
  long *plVar10;
  long *plVar11;
  long lVar12;
  long *plVar13;
  long *plVar14;
  void **ppvVar15;
  
  iVar3 = -0x16;
  if ((handle->flags & 4) == 0) {
    loop = handle->loop;
    iVar3 = 0;
    if (loop->inotify_fd == -1) {
      iVar3 = uv__inotify_init1(0x80800);
      if (iVar3 == -1) {
        piVar5 = __errno_location();
        if (*piVar5 == 0x26) {
          iVar3 = uv__inotify_init();
          if (iVar3 == -1) {
            iVar3 = -*piVar5;
          }
          else {
            iVar4 = uv__cloexec_ioctl(iVar3,1);
            if (iVar4 == 0) {
              iVar4 = uv__nonblock_ioctl(iVar3,1);
            }
            if (iVar4 != 0) {
              uv__close(iVar3);
              iVar3 = iVar4;
            }
          }
        }
        else {
          iVar3 = -*piVar5;
        }
      }
      if (-1 < iVar3) {
        loop->inotify_fd = iVar3;
        uv__io_init(&loop->inotify_read_watcher,uv__inotify_read,iVar3);
        uv__io_start(loop,&loop->inotify_read_watcher,1);
        iVar3 = 0;
      }
    }
    if (iVar3 == 0) {
      iVar3 = uv__inotify_add_watch(handle->loop->inotify_fd,path,0xfc6);
      if (iVar3 == -1) {
        piVar5 = __errno_location();
        iVar3 = -*piVar5;
      }
      else {
        for (plVar7 = (long *)handle->loop->inotify_watchers; plVar7 != (long *)0x0;
            plVar7 = (long *)*plVar7) {
          if ((int)plVar7[8] <= iVar3) {
            if (iVar3 <= (int)plVar7[8]) goto LAB_00487532;
            plVar7 = plVar7 + 1;
          }
        }
        plVar7 = (long *)0x0;
LAB_00487532:
        if (plVar7 == (long *)0x0) {
          sVar6 = strlen(path);
          plVar7 = (long *)uv__malloc(sVar6 + 0x49);
          if (plVar7 == (long *)0x0) {
            return -0xc;
          }
          *(int *)(plVar7 + 8) = iVar3;
          memcpy(plVar7 + 9,path,sVar6 + 1);
          plVar7[7] = (long)(plVar7 + 9);
          plVar7[4] = (long)(plVar7 + 4);
          plVar7[5] = (long)(plVar7 + 4);
          *(undefined4 *)(plVar7 + 6) = 0;
          plVar13 = (long *)handle->loop->inotify_watchers;
          if (plVar13 == (long *)0x0) {
            lVar12 = 8;
            plVar9 = (long *)0x0;
          }
          else {
            do {
              plVar9 = plVar13;
              iVar4 = (int)plVar9[8];
              plVar11 = plVar9;
              if (iVar4 <= iVar3) {
                if (iVar3 <= iVar4) goto LAB_004877c9;
                plVar11 = plVar9 + 1;
              }
              plVar13 = (long *)*plVar11;
            } while ((long *)*plVar11 != (long *)0x0);
            lVar12 = (ulong)(iVar4 <= iVar3) << 3;
          }
          ppvVar8 = &handle->loop->inotify_watchers;
          plVar7[2] = (long)plVar9;
          *plVar7 = 0;
          plVar7[1] = 0;
          *(undefined4 *)(plVar7 + 3) = 1;
          if (plVar9 == (long *)0x0) {
            *ppvVar8 = plVar7;
          }
          else {
            *(long **)((long)plVar9 + lVar12) = plVar7;
            plVar13 = plVar7;
            do {
              if ((int)plVar9[3] != 1) break;
              plVar11 = (long *)plVar9[2];
              plVar14 = (long *)*plVar11;
              plVar10 = plVar13;
              if (plVar9 == plVar14) {
                plVar14 = (long *)plVar11[1];
                if ((plVar14 != (long *)0x0) && ((int)plVar14[3] == 1)) goto LAB_0048765e;
                plVar14 = (long *)plVar9[1];
                if (plVar14 == plVar13) {
                  lVar12 = *plVar14;
                  plVar9[1] = lVar12;
                  if (lVar12 != 0) {
                    *(long **)(lVar12 + 0x10) = plVar9;
                  }
                  lVar12 = plVar9[2];
                  plVar14[2] = lVar12;
                  ppvVar15 = ppvVar8;
                  if (lVar12 != 0) {
                    ppvVar15 = (void **)((undefined8 *)plVar9[2] + (plVar9 != *(long **)plVar9[2]));
                  }
                  *ppvVar15 = plVar14;
                  *plVar14 = (long)plVar9;
                  plVar9[2] = (long)plVar14;
                  plVar10 = plVar9;
                  plVar9 = plVar13;
                }
                *(undefined4 *)(plVar9 + 3) = 0;
                *(undefined4 *)(plVar11 + 3) = 1;
                plVar13 = (long *)*plVar11;
                lVar12 = plVar13[1];
                *plVar11 = lVar12;
                if (lVar12 != 0) {
                  *(long **)(lVar12 + 0x10) = plVar11;
                }
                lVar12 = plVar11[2];
                plVar13[2] = lVar12;
                ppvVar15 = ppvVar8;
                if (lVar12 != 0) {
                  ppvVar15 = (void **)((undefined8 *)plVar11[2] + (plVar11 != *(long **)plVar11[2]))
                  ;
                }
                *ppvVar15 = plVar13;
                plVar13[1] = (long)plVar11;
LAB_004877a6:
                plVar11[2] = (long)plVar13;
                plVar11 = plVar10;
              }
              else {
                if ((plVar14 == (long *)0x0) || ((int)plVar14[3] != 1)) {
                  plVar14 = (long *)*plVar9;
                  if (plVar14 == plVar13) {
                    lVar12 = plVar14[1];
                    *plVar9 = lVar12;
                    if (lVar12 != 0) {
                      *(long **)(lVar12 + 0x10) = plVar9;
                    }
                    lVar12 = plVar9[2];
                    plVar14[2] = lVar12;
                    ppvVar15 = ppvVar8;
                    if (lVar12 != 0) {
                      ppvVar15 = (void **)((undefined8 *)plVar9[2] + (plVar9 != *(long **)plVar9[2])
                                          );
                    }
                    *ppvVar15 = plVar14;
                    plVar14[1] = (long)plVar9;
                    plVar9[2] = (long)plVar14;
                    plVar10 = plVar9;
                    plVar9 = plVar13;
                  }
                  *(undefined4 *)(plVar9 + 3) = 0;
                  *(undefined4 *)(plVar11 + 3) = 1;
                  plVar13 = (long *)plVar11[1];
                  lVar12 = *plVar13;
                  plVar11[1] = lVar12;
                  if (lVar12 != 0) {
                    *(long **)(lVar12 + 0x10) = plVar11;
                  }
                  lVar12 = plVar11[2];
                  plVar13[2] = lVar12;
                  ppvVar15 = ppvVar8;
                  if (lVar12 != 0) {
                    ppvVar15 = (void **)((undefined8 *)plVar11[2] +
                                        (plVar11 != *(long **)plVar11[2]));
                  }
                  *ppvVar15 = plVar13;
                  *plVar13 = (long)plVar11;
                  goto LAB_004877a6;
                }
LAB_0048765e:
                *(undefined4 *)(plVar14 + 3) = 0;
                *(undefined4 *)(plVar9 + 3) = 0;
                *(undefined4 *)(plVar11 + 3) = 1;
              }
              plVar9 = (long *)plVar11[2];
              plVar13 = plVar11;
            } while (plVar9 != (long *)0x0);
          }
          *(undefined4 *)((long)*ppvVar8 + 0x18) = 0;
        }
LAB_004877c9:
        uVar2 = handle->flags;
        if (((uVar2 & 4) == 0) && (handle->flags = uVar2 | 4, (uVar2 & 8) != 0)) {
          puVar1 = &handle->loop->active_handles;
          *puVar1 = *puVar1 + 1;
        }
        handle->watchers[0] = plVar7 + 4;
        plVar13 = (long *)plVar7[5];
        handle->watchers[1] = plVar13;
        *plVar13 = (long)handle->watchers;
        plVar7[5] = (long)handle->watchers;
        handle->path = (char *)plVar7[7];
        handle->cb = cb;
        handle->wd = iVar3;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int uv_fs_event_start(uv_fs_event_t* handle,
                      uv_fs_event_cb cb,
                      const char* path,
                      unsigned int flags) {
  struct watcher_list* w;
  size_t len;
  int events;
  int err;
  int wd;

  if (uv__is_active(handle))
    return UV_EINVAL;

  err = init_inotify(handle->loop);
  if (err)
    return err;

  events = UV__IN_ATTRIB
         | UV__IN_CREATE
         | UV__IN_MODIFY
         | UV__IN_DELETE
         | UV__IN_DELETE_SELF
         | UV__IN_MOVE_SELF
         | UV__IN_MOVED_FROM
         | UV__IN_MOVED_TO;

  wd = uv__inotify_add_watch(handle->loop->inotify_fd, path, events);
  if (wd == -1)
    return UV__ERR(errno);

  w = find_watcher(handle->loop, wd);
  if (w)
    goto no_insert;

  len = strlen(path) + 1;
  w = uv__malloc(sizeof(*w) + len);
  if (w == NULL)
    return UV_ENOMEM;

  w->wd = wd;
  w->path = memcpy(w + 1, path, len);
  QUEUE_INIT(&w->watchers);
  w->iterating = 0;
  RB_INSERT(watcher_root, CAST(&handle->loop->inotify_watchers), w);

no_insert:
  uv__handle_start(handle);
  QUEUE_INSERT_TAIL(&w->watchers, &handle->watchers);
  handle->path = w->path;
  handle->cb = cb;
  handle->wd = wd;

  return 0;
}